

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::SPxMainSM<double>::AggregationPS::execute
          (AggregationPS *this,VectorBase<double> *x,VectorBase<double> *y,VectorBase<double> *s,
          VectorBase<double> *r,DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  int iVar1;
  pointer pdVar2;
  Nonzero<double> *pNVar3;
  undefined1 auVar4 [16];
  double *pdVar5;
  undefined8 *puVar6;
  VarStatus VVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  double dVar11;
  double dVar12;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 *local_68;
  long local_60;
  undefined1 local_58 [16];
  double local_48;
  double dStack_40;
  
  iVar10 = this->m_i;
  iVar1 = this->m_old_i;
  if (iVar10 != iVar1) {
    pdVar2 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2[iVar1] = pdVar2[iVar10];
    pdVar2 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2[iVar1] = pdVar2[iVar10];
    rStatus->data[iVar1] = rStatus->data[iVar10];
  }
  iVar10 = this->m_j;
  iVar1 = this->m_old_j;
  if (iVar10 != iVar1) {
    pdVar2 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2[iVar1] = pdVar2[iVar10];
    pdVar2 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2[iVar1] = pdVar2[iVar10];
    cStatus->data[iVar1] = cStatus->data[iVar10];
  }
  dVar11 = SVectorBase<double>::operator[](&(this->m_row).super_SVectorBase<double>,iVar10);
  pNVar3 = (this->m_row).super_SVectorBase<double>.m_elem;
  dVar12 = 0.0;
  iVar10 = -1;
  lVar8 = 0;
  do {
    iVar1 = *(int *)((long)&pNVar3->idx + lVar8);
    if (iVar1 != this->m_j) {
      dVar12 = *(double *)((long)&pNVar3->val + lVar8) *
               (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar1];
      iVar10 = iVar1;
    }
    lVar8 = lVar8 + 0x10;
  } while (lVar8 == 0x10);
  dVar13 = ABS(this->m_rhs);
  auVar14._8_8_ = dVar12;
  auVar14._0_8_ = this->m_rhs;
  if (dVar13 <= ABS(dVar12)) {
    dVar13 = ABS(dVar12);
  }
  dVar12 = 1.0;
  if (1.0 <= dVar13) {
    dVar12 = dVar13;
  }
  auVar4._8_8_ = dVar12;
  auVar4._0_8_ = dVar12;
  auVar14 = divpd(auVar14,auVar4);
  dStack_40 = auVar14._8_8_;
  local_48 = auVar14._0_8_ - dStack_40;
  (*(this->super_PostStep)._vptr_PostStep[7])();
  iVar1 = this->m_j;
  pdVar2 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2[iVar1] =
       ((double)(~-(ulong)(ABS(local_48) <= extraout_XMM0_Qa) & (ulong)local_48) * dVar12) / dVar11;
  (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[this->m_i] = this->m_rhs;
  if ((isOptimal) &&
     ((dVar12 = pdVar2[iVar1], dVar13 = this->m_lower,
      (*(this->super_PostStep)._vptr_PostStep[6])(this), dVar12 - dVar13 < -extraout_XMM0_Qa_00 ||
      (dVar12 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[this->m_j], dVar13 = this->m_upper,
      (*(this->super_PostStep)._vptr_PostStep[6])(), extraout_XMM0_Qa_01 < dVar12 - dVar13)))) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"EMAISM: numerical violation after disaggregating variable",
               0x39);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
  }
  lVar8 = (long)(this->m_col).super_SVectorBase<double>.memused;
  if (lVar8 < 1) {
    dVar12 = 0.0;
  }
  else {
    pNVar3 = (this->m_col).super_SVectorBase<double>.m_elem;
    dVar12 = 0.0;
    lVar9 = 0;
    do {
      iVar1 = *(int *)((long)&pNVar3->idx + lVar9);
      if (iVar1 != this->m_i) {
        dVar12 = dVar12 + *(double *)((long)&pNVar3->val + lVar9) *
                          (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar1];
      }
      lVar9 = lVar9 + 0x10;
    } while (lVar8 * 0x10 != lVar9);
  }
  (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[this->m_i] = (this->m_obj - dVar12) / dVar11;
  (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[this->m_j] = 0.0;
  if ((((cStatus->data[iVar10] & ~FIXED) == ON_UPPER) &&
      (dVar11 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar10], dVar12 = this->m_oldupper,
      (*(this->super_PostStep)._vptr_PostStep[6])(this), extraout_XMM0_Qa_02 < ABS(dVar11 - dVar12))
      ) || ((cStatus->data[iVar10] - ON_LOWER < 2 &&
            (dVar11 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar10], dVar12 = this->m_oldlower,
            (*(this->super_PostStep)._vptr_PostStep[6])(this),
            extraout_XMM0_Qa_03 < ABS(dVar11 - dVar12))))) {
    cStatus->data[iVar10] = BASIC;
    (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar10] = 0.0;
    dVar11 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[this->m_j];
    dVar12 = this->m_upper;
    (*(this->super_PostStep)._vptr_PostStep[6])(this);
    VVar7 = ON_UPPER;
    iVar10 = this->m_j;
    if (extraout_XMM0_Qa_04 < ABS(dVar11 - dVar12)) {
      dVar11 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar10];
      dVar12 = this->m_lower;
      (*(this->super_PostStep)._vptr_PostStep[6])(this);
      if (extraout_XMM0_Qa_05 < ABS(dVar11 - dVar12)) {
        dVar11 = this->m_upper;
        ::soplex::infinity::__tls_init();
        pdVar5 = (double *)__tls_get_addr(&PTR_003b6b60);
        dVar12 = *pdVar5;
        if ((dVar11 < dVar12) ||
           (dVar11 = this->m_lower, ::soplex::infinity::__tls_init(), -dVar12 < dVar11)) {
          puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
          local_68 = local_58;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,
                     "XMAISM unexpected basis status in aggregation unsimplifier.","");
          *puVar6 = &PTR__SPxException_003af870;
          puVar6[1] = puVar6 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar6 + 1),local_68,local_68 + local_60);
          *puVar6 = &PTR__SPxException_003b0638;
          __cxa_throw(puVar6,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
        }
        iVar10 = this->m_j;
        VVar7 = ZERO;
      }
      else {
        iVar10 = this->m_j;
        VVar7 = ON_LOWER;
      }
    }
  }
  else {
    iVar10 = this->m_j;
    VVar7 = BASIC;
  }
  cStatus->data[iVar10] = VVar7;
  rStatus->data[this->m_i] = ON_UPPER;
  return;
}

Assistant:

void SPxMainSM<R>::AggregationPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // correcting the change of idx by deletion of the column:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal:
   R val = 0.0;
   R aij = m_row[m_j];
   int active_idx = -1;

   assert(m_row.size() == 2);

   for(int k = 0; k < 2; ++k)
   {
      if(m_row.index(k) != m_j)
      {
         active_idx = m_row.index(k);
         val = m_row.value(k) * x[active_idx];
      }
   }

   assert(active_idx >= 0);

   R scale = maxAbs(m_rhs, val);

   if(scale < 1.0)
      scale = 1.0;

   R z = (m_rhs / scale) - (val / scale);

   if(isZero(z, this->epsilon()))
      z = 0.0;

   x[m_j] = z * scale / aij;
   s[m_i] = m_rhs;

   if(isOptimal && (LT(x[m_j], m_lower, this->feastol()) || GT(x[m_j], m_upper, this->feastol())))
   {
      SPX_MSG_ERROR(std::cerr << "EMAISM: numerical violation after disaggregating variable" << std::endl;
                   )
   }

   // dual:
   R dualVal = 0.0;

   for(int k = 0; k < m_col.size(); ++k)
   {
      if(m_col.index(k) != m_i)
         dualVal += m_col.value(k) * y[m_col.index(k)];
   }

   z = m_obj - dualVal;

   y[m_i] = z / aij;
   r[m_j] = 0.0;

   // basis:
   if(((cStatus[active_idx] == SPxSolverBase<R>::ON_UPPER
         || cStatus[active_idx] == SPxSolverBase<R>::FIXED)
         && NE(x[active_idx], m_oldupper, this->feastol())) ||
         ((cStatus[active_idx] == SPxSolverBase<R>::ON_LOWER
           || cStatus[active_idx] == SPxSolverBase<R>::FIXED)
          && NE(x[active_idx], m_oldlower, this->feastol())))
   {
      cStatus[active_idx] = SPxSolverBase<R>::BASIC;
      r[active_idx] = 0.0;
      assert(NE(m_upper, m_lower, this->epsilon()));

      if(EQ(x[m_j], m_upper, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else if(EQ(x[m_j], m_lower, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      else if(m_upper >= R(infinity) && m_lower <= R(-infinity))
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM unexpected basis status in aggregation unsimplifier.");
   }
   else
   {
      cStatus[m_j] = SPxSolverBase<R>::BASIC;
   }

   // sides may not be equal and we always only consider the rhs during aggregation, so set ON_UPPER
   // (in theory and with exact arithmetic setting it to FIXED would be correct)
   rStatus[m_i] = SPxSolverBase<R>::ON_UPPER;

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM22 Dimension doesn't match after this step.");
   }

#endif
}